

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Abc_NtkDelayOpt(Sfm_Dec_t *p)

{
  Vec_Int_t *vCands;
  Vec_Int_t *vNewNodes;
  uint Id;
  uint uVar1;
  uint uVar2;
  Sfm_Par_t *pPars;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  abctime aVar8;
  abctime aVar9;
  Sfm_Mit_t *pMit;
  int iVar10;
  ulong uVar11;
  int iVar12;
  float fVar13;
  
  pPars = p->pPars;
  pNtk = p->pNtk;
  Abc_NtkCleanMarkABC(pNtk);
  vCands = &p->vCands;
  vNewNodes = &p->vNewNodes;
  iVar12 = 0;
  do {
    if (pPars->nNodesMax <= iVar12 && pPars->nNodesMax != 0) break;
    if (pPars->iNodeOne == 0) {
      if (p->pTim != (Sfm_Tim_t *)0x0) {
        iVar3 = Sfm_TimPriorityNodes(p->pTim,vCands,p->pPars->nTimeWin);
        if (iVar3 == 0) break;
      }
      if (p->pMit != (Sfm_Mit_t *)0x0) {
        iVar3 = Sfm_MitPriorityNodes(p->pMit,vCands,p->pPars->nTimeWin);
        if (iVar3 == 0) break;
      }
    }
    else {
      Vec_IntFill(vCands,1,pPars->iNodeOne);
    }
    uVar11 = 0;
    while (iVar3 = (int)uVar11, iVar3 < (p->vCands).nSize) {
      pNtk_00 = p->pNtk;
      iVar4 = Vec_IntEntry(vCands,iVar3);
      pAVar7 = Abc_NtkObj(pNtk_00,iVar4);
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        Id = pAVar7->Id;
        iVar4 = Sfm_ManReadObjDelay(p,Id);
        if ((pAVar7->field_0x14 & 0x10) != 0) {
          __assert_fail("pObj->fMarkA == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x7d5,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
        }
        p->nNodesTried = p->nNodesTried + 1;
        aVar8 = Abc_Clock();
        iVar5 = Sfm_DecExtract(pNtk,pPars,pAVar7,&p->vObjRoots,&p->vObjGates,&p->vObjFanins,
                               &p->vObjMap,&p->vGateTfi,&p->vGateTfo,&p->vObjMffc,&p->vObjInMffc,
                               p->pTim,p->pMit);
        p->nDivs = iVar5;
        aVar9 = Abc_Clock();
        p->timeWin = p->timeWin + (aVar9 - aVar8);
        if ((1 < p->nDivs) &&
           ((pPars->nWinSizeMax == 0 || ((p->vObjGates).nSize <= pPars->nWinSizeMax)))) {
          p->nMffc = (p->vObjMffc).nSize;
          iVar5 = Sfm_DecMffcArea(pNtk,&p->vObjMffc);
          p->AreaMffc = iVar5;
          iVar5 = p->nDivs;
          iVar6 = p->nMaxDivs;
          if (p->nMaxDivs <= iVar5) {
            iVar6 = iVar5;
          }
          p->nMaxDivs = iVar6;
          p->nAllDivs = p->nAllDivs + (long)iVar5;
          p->iTarget = (pAVar7->field_6).iTemp;
          iVar5 = (p->vObjGates).nSize;
          iVar6 = p->nMaxWin;
          if (p->nMaxWin <= iVar5) {
            iVar6 = iVar5;
          }
          p->nMaxWin = iVar6;
          p->nAllWin = p->nAllWin + (long)iVar5;
          aVar8 = Abc_Clock();
          iVar6 = Sfm_DecPrepareSolver(p);
          aVar9 = Abc_Clock();
          p->timeCnf = p->timeCnf + (aVar9 - aVar8);
          if (iVar6 != 0) {
            aVar8 = Abc_Clock();
            iVar6 = Sfm_DecPeformDec3(p,pAVar7);
            if ((pPars->fMoreEffort != 0) && (iVar6 < 0)) {
              iVar10 = (p->vObjInMffc).nSize;
              do {
                if (iVar10 < 1) goto LAB_004491ad;
                iVar10 = iVar10 + -1;
                iVar6 = Vec_IntEntry(&p->vObjInMffc,iVar10);
                p->iUseThis = iVar6;
                iVar6 = Sfm_DecPeformDec3(p,pAVar7);
                p->iUseThis = -1;
              } while (iVar6 < 0);
              p->nEfforts = p->nEfforts + 1;
            }
LAB_004491ad:
            if (p->pPars->fVeryVerbose != 0) {
              puts("\n");
            }
            aVar9 = Abc_Clock();
            p->timeSat = p->timeSat + (aVar9 - aVar8);
            if (-1 < iVar6) {
              iVar3 = (p->vObjGates).nSize;
              if (iVar3 <= iVar5) {
                __assert_fail("Vec_IntSize(&p->vObjGates) - Limit > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                              ,0x811,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
              }
              if (2 < iVar3 - iVar5) {
                __assert_fail("Vec_IntSize(&p->vObjGates) - Limit <= 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                              ,0x812,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
              }
              p->nNodesChanged = p->nNodesChanged + 1;
              Abc_NtkCountStats(p,iVar5);
              if (p->pMit == (Sfm_Mit_t *)0x0) {
                pMit = (Sfm_Mit_t *)0x0;
              }
              else {
                Sfm_MitUpdateLoad(p->pMit,&p->vGateMffc,0);
                pMit = p->pMit;
              }
              Sfm_DecInsert(pNtk,pAVar7,iVar5,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                            &p->vGateHands,p->GateBuffer,p->GateInvert,&p->vGateFuncs,vNewNodes,pMit
                           );
              if (p->pMit != (Sfm_Mit_t *)0x0) {
                Sfm_MitUpdateLoad(p->pMit,vNewNodes,1);
              }
              aVar8 = Abc_Clock();
              if (p->pMit == (Sfm_Mit_t *)0x0) {
                Sfm_TimUpdateTiming(p->pTim,vNewNodes);
              }
              else {
                Sfm_MitUpdateTiming(p->pMit,vNewNodes);
              }
              aVar9 = Abc_Clock();
              p->timeTime = p->timeTime + (aVar9 - aVar8);
              pAVar7 = Abc_NtkObj(pNtk,pNtk->vObjs->nSize + -1);
              if ((p->pMit == (Sfm_Mit_t *)0x0) && (iVar3 = p->DelayMin, iVar3 != 0)) {
                iVar5 = Sfm_ManReadObjDelay(p,pAVar7->Id);
                if (iVar3 != iVar5) {
                  __assert_fail("p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                                ,0x821,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                }
              }
              if (pPars->fDelayVerbose != 0) {
                uVar1 = p->pNtk->vObjs->nSize;
                uVar2 = (p->vCands).nSize;
                iVar3 = p->pNtk->nObjCounts[7];
                iVar5 = Sfm_ManReadObjDelay(p,pAVar7->Id);
                if (p->pMit == (Sfm_Mit_t *)0x0) {
                  iVar6 = Sfm_TimReadNtkDelay(p->pTim);
                }
                else {
                  iVar6 = Sfm_MitReadNtkDelay(p->pMit);
                }
                if (p->pMit == (Sfm_Mit_t *)0x0) {
                  fVar13 = 0.0;
                }
                else {
                  iVar10 = Sfm_MitReadNtkMinSlack(p->pMit);
                  fVar13 = (float)iVar10;
                }
                printf("Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f.  WNS =%8.2f.\n"
                       ,((double)(int)uVar2 * 100.0) / (double)iVar3,(double)((float)iVar4 / 1000.0)
                       ,(double)((float)iVar5 / 1000.0),(double)((float)iVar6 / 1000.0),
                       (double)(fVar13 / 1000.0),(ulong)Id,(ulong)uVar1,uVar11,(ulong)uVar2);
              }
              break;
            }
          }
        }
        pAVar7->field_0x14 = pAVar7->field_0x14 | 0x10;
      }
      uVar11 = (ulong)(iVar3 + 1);
    }
    iVar12 = iVar12 + 1;
  } while (pPars->iNodeOne == 0);
  Abc_NtkCleanMarkABC(pNtk);
  return;
}

Assistant:

void Abc_NtkDelayOpt( Sfm_Dec_t * p )
{
    Abc_Ntk_t * pNtk = p->pNtk;
    Sfm_Par_t * pPars = p->pPars; int n;
    Abc_NtkCleanMarkABC( pNtk );
    for ( n = 0; pPars->nNodesMax == 0 || n < pPars->nNodesMax; n++ )
    {
        Abc_Obj_t * pObj, * pObjNew; abctime clk;
        int i = 0, Limit, RetValue;
        // collect nodes
        if ( pPars->iNodeOne )
            Vec_IntFill( &p->vCands, 1, pPars->iNodeOne );
        else if ( p->pTim && !Sfm_TimPriorityNodes(p->pTim, &p->vCands, p->pPars->nTimeWin) )
            break;
        else if ( p->pMit && !Sfm_MitPriorityNodes(p->pMit, &p->vCands, p->pPars->nTimeWin) )
            break;
        // try improving delay for the nodes according to the priority
        Abc_NtkForEachObjVec( &p->vCands, p->pNtk, pObj, i )
        {
            int OldId = Abc_ObjId(pObj);
            int DelayOld = Sfm_ManReadObjDelay(p, OldId);
            assert( pObj->fMarkA == 0 );
            p->nNodesTried++;
clk = Abc_Clock();
            p->nDivs = Sfm_DecExtract( pNtk, pPars, pObj, &p->vObjRoots, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateTfi, &p->vGateTfo, &p->vObjMffc, &p->vObjInMffc, p->pTim, p->pMit );
p->timeWin += Abc_Clock() - clk;
            if ( p->nDivs < 2 || (pPars->nWinSizeMax && pPars->nWinSizeMax < Vec_IntSize(&p->vObjGates)) )
            { 
                pObj->fMarkA = 1;
                continue;
            }
            p->nMffc = Vec_IntSize(&p->vObjMffc);
            p->AreaMffc = Sfm_DecMffcArea(pNtk, &p->vObjMffc);
            p->nMaxDivs = Abc_MaxInt( p->nMaxDivs, p->nDivs );
            p->nAllDivs += p->nDivs;
            p->iTarget = pObj->iTemp;
            Limit = Vec_IntSize( &p->vObjGates );
            p->nMaxWin = Abc_MaxInt( p->nMaxWin, Limit );
            p->nAllWin += Limit;
clk = Abc_Clock();
            RetValue = Sfm_DecPrepareSolver( p );
p->timeCnf += Abc_Clock() - clk;
            if ( !RetValue )
            {
                pObj->fMarkA = 1;
                continue;
            }
clk = Abc_Clock();
            RetValue = Sfm_DecPeformDec3( p, pObj );
            if ( pPars->fMoreEffort && RetValue < 0 )
            {
                int Var, i;
                Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
                {
                    p->iUseThis = Var; 
                    RetValue = Sfm_DecPeformDec3( p, pObj );
                    p->iUseThis = -1;
                    if ( RetValue < 0 )
                    {
                        //printf( "Node %d: Not found among %d.\n", Abc_ObjId(pObj), Vec_IntSize(&p->vObjInMffc) );
                    }
                    else
                    {
                        p->nEfforts++;
                        if ( p->pPars->fVerbose )
                        {
                            //printf( "Node %5d: (%2d out of %2d)  Gate=%s ", Abc_ObjId(pObj), i, Vec_IntSize(&p->vObjInMffc), Mio_GateReadName((Mio_Gate_t*)pObj->pData) );
                            //Dau_DsdPrintFromTruth( p->Copy, p->nSuppVars );
                        }
                        break;
                    }
                }
            }
            if ( p->pPars->fVeryVerbose )
                printf( "\n\n" );
p->timeSat += Abc_Clock() - clk;
            if ( RetValue < 0 )
            {
                pObj->fMarkA = 1;
                continue;
            }
            assert( Vec_IntSize(&p->vObjGates) - Limit > 0 );
            assert( Vec_IntSize(&p->vObjGates) - Limit <= 2 );
            p->nNodesChanged++;
            Abc_NtkCountStats( p, Limit );
            // reduce load due to removed MFFC
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vGateMffc, 0 ); // assuming &p->vGateMffc contains MFFC
            Sfm_DecInsert( pNtk, pObj, Limit, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateHands, p->GateBuffer, p->GateInvert, &p->vGateFuncs, &p->vNewNodes, p->pMit );
            // increase load due to added new nodes
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vNewNodes, 1 ); // assuming &p->vNewNodes contains new nodes
clk = Abc_Clock();
            if ( p->pMit )
                Sfm_MitUpdateTiming( p->pMit, &p->vNewNodes );
            else
                Sfm_TimUpdateTiming( p->pTim, &p->vNewNodes );
p->timeTime += Abc_Clock() - clk;
            pObjNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk)-1 );
            assert( p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew)) );
            // report
            if ( pPars->fDelayVerbose )
                printf( "Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f.  WNS =%8.2f.\n", 
                    OldId, Abc_NtkObjNumMax(p->pNtk), i, Vec_IntSize(&p->vCands), 100.0 * Vec_IntSize(&p->vCands) / Abc_NtkNodeNum(p->pNtk),
                    Scl_Int2Flt(DelayOld), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))), 
                    Scl_Int2Flt(Sfm_ManReadNtkDelay(p)), Scl_Int2Flt(Sfm_ManReadNtkMinSlack(p)) );
            break;
        }
        if ( pPars->iNodeOne )
            break;
    }
    Abc_NtkCleanMarkABC( pNtk );
}